

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mutex_posix.c
# Opt level: O3

int mutex_init(mutex_handle *mutex)

{
  int iVar1;
  pthread_cond_t *__cond;
  
  __cond = (pthread_cond_t *)mutex->priv;
  if (__cond == (pthread_cond_t *)0x0) {
    __cond = (pthread_cond_t *)calloc(1,0x60);
    if (__cond == (pthread_cond_t *)0x0) {
      return -0xc;
    }
    mutex->priv = __cond;
  }
  iVar1 = pthread_mutex_init((pthread_mutex_t *)(__cond + 1),(pthread_mutexattr_t *)0x0);
  if (iVar1 == 0) {
    iVar1 = pthread_cond_init(__cond,(pthread_condattr_t *)0x0);
    if (iVar1 == 0) {
      return 0;
    }
    pthread_mutex_destroy((pthread_mutex_t *)(__cond + 1));
  }
  free(mutex->priv);
  mutex->priv = (void *)0x0;
  return -iVar1;
}

Assistant:

int mutex_init(struct mutex_handle *mutex)
{
	struct mutex_priv *priv = mutex->priv;
	int ret;

	if (priv == NULL) {
		priv = calloc(1, sizeof(*priv));
		if (priv == NULL)
			return -ENOMEM;

		mutex->priv = priv;
	}

	ret = pthread_mutex_init(&priv->lock, NULL);
	if (ret != 0) {
		ret = -ret;

		goto mutex_init_exit;
	}

	ret = pthread_cond_init(&priv->cond, NULL);
	if (ret != 0) {
		ret = -ret;

		goto mutex_init_exit_late;
	}

	return 0;

mutex_init_exit_late:
	pthread_mutex_destroy(&priv->lock);

mutex_init_exit:
	free(mutex->priv);
	mutex->priv = NULL;

	return ret;
}